

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O2

FT_Error tt_face_load_cvt(TT_Face face,FT_Stream stream)

{
  FT_UShort *pFVar1;
  FT_Memory memory;
  FT_UShort FVar2;
  FT_Short *pFVar3;
  FT_UShort *pFVar4;
  int local_2c;
  FT_ULong table_len;
  
  memory = stream->memory;
  local_2c = (*face->goto_table)(face,0x63767420,stream,&table_len);
  if (local_2c == 0) {
    face->cvt_size = table_len >> 1;
    pFVar3 = (FT_Short *)ft_mem_realloc(memory,2,0,table_len >> 1,(void *)0x0,&local_2c);
    face->cvt = pFVar3;
    if ((local_2c == 0) &&
       (local_2c = FT_Stream_EnterFrame(stream,face->cvt_size * 2), local_2c == 0)) {
      pFVar4 = (FT_UShort *)face->cvt;
      pFVar1 = pFVar4 + face->cvt_size;
      for (; pFVar4 < pFVar1; pFVar4 = pFVar4 + 1) {
        FVar2 = FT_Stream_GetUShort(stream);
        *pFVar4 = FVar2;
      }
      FT_Stream_ExitFrame(stream);
      if (face->doblend != '\0') {
        local_2c = tt_face_vary_cvt(face,stream);
      }
    }
  }
  else {
    face->cvt_size = 0;
    face->cvt = (FT_Short *)0x0;
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cvt( TT_Face    face,
                    FT_Stream  stream )
  {
#ifdef TT_USE_BYTECODE_INTERPRETER

    FT_Error   error;
    FT_Memory  memory = stream->memory;
    FT_ULong   table_len;


    FT_TRACE2(( "CVT " ));

    error = face->goto_table( face, TTAG_cvt, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));

      face->cvt_size = 0;
      face->cvt      = NULL;
      error          = FT_Err_Ok;

      goto Exit;
    }

    face->cvt_size = table_len / 2;

    if ( FT_NEW_ARRAY( face->cvt, face->cvt_size ) )
      goto Exit;

    if ( FT_FRAME_ENTER( face->cvt_size * 2L ) )
      goto Exit;

    {
      FT_Short*  cur   = face->cvt;
      FT_Short*  limit = cur + face->cvt_size;


      for ( ; cur < limit; cur++ )
        *cur = FT_GET_SHORT();
    }

    FT_FRAME_EXIT();
    FT_TRACE2(( "loaded\n" ));

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->doblend )
      error = tt_face_vary_cvt( face, stream );
#endif

  Exit:
    return error;

#else /* !TT_USE_BYTECODE_INTERPRETER */

    FT_UNUSED( face   );
    FT_UNUSED( stream );

    return FT_Err_Ok;

#endif
  }